

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O2

string * __thiscall
chaiscript::ChaiScript_Basic::load_module
          (string *__return_storage_ptr__,ChaiScript_Basic *this,string *t_module_name)

{
  size_type __pos;
  load_module_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar1;
  pointer __lhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_17c;
  allocator<char> local_17b;
  allocator_type local_17a;
  allocator<char> local_179 [9];
  string *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  errors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postfixes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prefixes;
  string version_stripped_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  errors.
  super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  errors.
  super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.
  super__Vector_base<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170 = t_module_name;
  std::__cxx11::string::string((string *)&version_stripped_name,t_module_name);
  Build_Info::version_abi_cxx11_();
  std::operator+(&local_b0,"-",&local_168);
  __pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (&version_stripped_name,&local_b0,0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_168);
  if (__pos != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&version_stripped_name,__pos,0xffffffffffffffff);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"lib",(allocator<char> *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"cyg",(allocator<char> *)&postfixes);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"",&local_17b);
  __l._M_len = 3;
  __l._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&prefixes,__l,&local_17c);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,".dll",(allocator<char> *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>(local_90,".so",&local_17b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,".bundle",(allocator<char> *)&local_17c);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"",local_179);
  __l_00._M_len = 4;
  __l_00._M_array = &local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&postfixes,__l_00,&local_17a);
  lVar1 = 0x60;
  do {
    std::__cxx11::string::~string((string *)((long)&local_b0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  __lhs = (this->m_module_paths).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    __rhs = prefixes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (__lhs == (this->m_module_paths).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = (load_module_error *)__cxa_allocate_exception(0x10);
      exception::load_module_error::load_module_error(this_00,local_170,&errors);
      __cxa_throw(this_00,&exception::load_module_error::typeinfo,std::runtime_error::~runtime_error
                 );
    }
    for (; __rhs != prefixes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      if (postfixes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          postfixes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_168,__lhs,__rhs);
        std::operator+(&local_b0,&local_168,local_170);
        std::operator+(__return_storage_ptr__,&local_b0,
                       postfixes.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_168);
        load_module(this,&version_stripped_name,__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&postfixes);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&prefixes);
        std::__cxx11::string::~string((string *)&version_stripped_name);
        std::
        vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
        ::~vector(&errors);
        return __return_storage_ptr__;
      }
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

std::string load_module(const std::string &t_module_name) {
#ifdef CHAISCRIPT_NO_DYNLOAD
      throw chaiscript::exception::load_module_error("Loadable module support was disabled (CHAISCRIPT_NO_DYNLOAD)");
#else
      std::vector<exception::load_module_error> errors;
      std::string version_stripped_name = t_module_name;
      size_t version_pos = version_stripped_name.find("-" + Build_Info::version());
      if (version_pos != std::string::npos) {
        version_stripped_name.erase(version_pos);
      }

      std::vector<std::string> prefixes{"lib", "cyg", ""};

      std::vector<std::string> postfixes{".dll", ".so", ".bundle", ""};

      for (auto &elem : m_module_paths) {
        for (auto &prefix : prefixes) {
          for (auto &postfix : postfixes) {
            try {
              const auto name = elem + prefix + t_module_name + postfix;
              // std::cerr << "trying location: " << name << '\n';
              load_module(version_stripped_name, name);
              return name;
            } catch (const chaiscript::exception::load_module_error &e) {
              // std::cerr << "error: " << e.what() << '\n';
              errors.push_back(e);
              // Try next set
            }
          }
        }
      }

      throw chaiscript::exception::load_module_error(t_module_name, errors);
#endif
    }